

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O2

uint64_t __thiscall
spvtools::opt::ScalarReplacementPass::GetArrayLength
          (ScalarReplacementPass *this,Instruction *arrayType)

{
  uint32_t id;
  DefUseManager *this_00;
  Instruction *inst;
  ConstantManager *this_01;
  Constant *this_02;
  uint64_t uVar1;
  
  if (arrayType->opcode_ == OpTypeArray) {
    this_00 = Pass::get_def_use_mgr((Pass *)this);
    id = Instruction::GetSingleWordInOperand(arrayType,1);
    inst = analysis::DefUseManager::GetDef(this_00,id);
    this_01 = IRContext::get_constant_mgr((this->super_MemPass).super_Pass.context_);
    this_02 = analysis::ConstantManager::GetConstantFromInst(this_01,inst);
    uVar1 = analysis::Constant::GetZeroExtendedValue(this_02);
    return uVar1;
  }
  __assert_fail("arrayType->opcode() == spv::Op::OpTypeArray",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                ,0x236,
                "uint64_t spvtools::opt::ScalarReplacementPass::GetArrayLength(const Instruction *) const"
               );
}

Assistant:

uint64_t ScalarReplacementPass::GetArrayLength(
    const Instruction* arrayType) const {
  assert(arrayType->opcode() == spv::Op::OpTypeArray);
  const Instruction* length =
      get_def_use_mgr()->GetDef(arrayType->GetSingleWordInOperand(1u));
  return context()
      ->get_constant_mgr()
      ->GetConstantFromInst(length)
      ->GetZeroExtendedValue();
}